

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

uint32_t perfetto::SharedMemoryABI::GetUsedChunks(uint32_t page_layout)

{
  uint uVar1;
  uint uVar2;
  uint32_t i;
  int iVar3;
  uint uVar4;
  
  uVar1 = page_layout >> 0x1a;
  uVar2 = 0;
  for (iVar3 = 0; *(int *)((long)kNumChunksForLayout + (ulong)(uVar1 & 0x1c)) != iVar3;
      iVar3 = iVar3 + 1) {
    uVar4 = 1 << ((byte)iVar3 & 0x1f);
    if ((page_layout & 3) == 0) {
      uVar4 = 0;
    }
    uVar2 = uVar2 | uVar4;
    page_layout = page_layout >> 2;
  }
  return uVar2;
}

Assistant:

static constexpr uint32_t GetNumChunksForLayout(uint32_t page_layout) {
    return kNumChunksForLayout[(page_layout & kLayoutMask) >> kLayoutShift];
  }